

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::to_string_abi_cxx11_
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,
          basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *this)

{
  basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
  encoder;
  allocator<char> local_191;
  string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_190;
  basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
  local_188;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  local_190.buf_ptr = __return_storage_ptr__;
  basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
  ::basic_compact_json_encoder(&local_188,&local_190,&local_191);
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
             &local_188.super_basic_json_visitor<wchar_t>);
  basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
  ::~basic_compact_json_encoder(&local_188);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<char_type> to_string() const noexcept
        {
            using string_type2 = std::basic_string<char_type>;
            string_type2 s;
            basic_compact_json_encoder<char_type, jsoncons::string_sink<string_type2>> encoder(s);
            dump(encoder);
            return s;
        }